

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

GatherNDLayerParams * __thiscall
CoreML::Specification::GatherNDLayerParams::New(GatherNDLayerParams *this,Arena *arena)

{
  GatherNDLayerParams *this_00;
  
  this_00 = (GatherNDLayerParams *)operator_new(0x18);
  GatherNDLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GatherNDLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GatherNDLayerParams* GatherNDLayerParams::New(::google::protobuf::Arena* arena) const {
  GatherNDLayerParams* n = new GatherNDLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}